

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.cpp
# Opt level: O0

void __thiscall BaseTest::solve<KruskalMST>(BaseTest *this,char *info)

{
  ostream *poVar1;
  rep rVar2;
  ostream *this_00;
  ostream *__args_1;
  ostream *this_01;
  ostream *poVar3;
  char *in_RSI;
  double dVar4;
  rep time;
  double ans;
  KruskalMST solver;
  time_point beg;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff58;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  vector<Point2d,_std::allocator<Point2d>_> *in_stack_ffffffffffffffa8;
  KruskalMST *in_stack_ffffffffffffffb0;
  
  poVar1 = std::operator<<((ostream *)&std::cout,in_RSI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::chrono::_V2::system_clock::now();
  KruskalMST::KruskalMST(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  dVar4 = KruskalMST::operator()(in_stack_ffffffffffffffb0);
  std::chrono::_V2::system_clock::now();
  local_60.__r = (rep)std::chrono::operator-(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,"use time : ");
  this_00 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  __args_1 = (ostream *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = std::operator<<(__args_1,"result : ");
  poVar3 = (ostream *)std::ostream::operator<<(this_01,dVar4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::vector<BaseTest::Result,std::allocator<BaseTest::Result>>::
  emplace_back<char_const*&,double&,long&>
            ((vector<BaseTest::Result,_std::allocator<BaseTest::Result>_> *)poVar1,(char **)this_00,
             (double *)__args_1,(long *)this_01);
  KruskalMST::~KruskalMST((KruskalMST *)0x107c78);
  return;
}

Assistant:

void BaseTest::solve(const char *info)
{
	std::cout << info << std::endl;
	auto beg = now();
	MSTSolver solver(input);
	double ans = solver();
	auto time = (now() - beg).count();
	std::cout << "use time : " << time << std::endl
	          << "result : " << ans << std::endl
	          << std::endl;
	results.emplace_back(info, ans, time);
}